

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render_map.cpp
# Opt level: O0

float SolveBezier(float x,float p0,float p1,float p2,float p3)

{
  float in_XMM0_Da;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  double s_2;
  double phi;
  double s_1;
  double s;
  double D_1;
  double q;
  double p;
  double sub;
  double D;
  double x0;
  double x1;
  double x2;
  double x3;
  double t;
  double c;
  double b;
  double a;
  double in_stack_ffffffffffffff28;
  undefined4 local_4;
  
  if (((((in_XMM0_Da < in_XMM1_Da) || (in_XMM4_Da < in_XMM0_Da)) || (in_XMM2_Da < in_XMM1_Da)) ||
      ((in_XMM4_Da < in_XMM2_Da || (in_XMM3_Da < in_XMM1_Da)))) || (in_XMM4_Da < in_XMM3_Da)) {
    local_4 = 0.0;
  }
  else {
    dVar1 = (double)(in_XMM3_Da * -3.0 + in_XMM2_Da * 3.0 + -in_XMM1_Da + in_XMM4_Da);
    dVar2 = (double)(in_XMM3_Da * 3.0 + in_XMM1_Da * 3.0 + -(in_XMM2_Da * 6.0));
    dVar3 = (double)(in_XMM1_Da * -3.0 + in_XMM2_Da * 3.0);
    dVar4 = (double)(in_XMM1_Da - in_XMM0_Da);
    if (((dVar1 != 0.0) || (NAN(dVar1))) || ((dVar2 != 0.0 || (NAN(dVar2))))) {
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        dVar2 = dVar2 / dVar1;
        dVar5 = dVar2 / 3.0;
        dVar6 = (dVar3 / dVar1) / 3.0 - (dVar2 * dVar2) / 9.0;
        dVar1 = (((dVar2 * 2.0 * dVar2 * dVar2) / 27.0 - (dVar2 * (dVar3 / dVar1)) / 3.0) +
                dVar4 / dVar1) / 2.0;
        dVar3 = dVar1 * dVar1 + dVar6 * dVar6 * dVar6;
        if (dVar3 <= 0.0) {
          if ((dVar3 != 0.0) || (NAN(dVar3))) {
            dVar3 = sqrt(-(dVar6 * dVar6 * dVar6));
            dVar3 = acos(-dVar1 / dVar3);
            dVar3 = dVar3 / 3.0;
            dVar1 = sqrt(-dVar6);
            dVar1 = dVar1 * 2.0;
            dVar4 = cos(dVar3);
            dVar4 = dVar1 * dVar4 + -dVar5;
            if ((dVar4 < 0.0) || (1.000100016593933 < dVar4)) {
              dVar4 = cos(dVar3 + 1.0471975803375244);
              dVar4 = -dVar1 * dVar4 + -dVar5;
              if ((dVar4 < 0.0) || (1.000100016593933 < dVar4)) {
                dVar1 = -dVar1;
                dVar3 = cos(dVar3 - 1.0471975803375244);
                local_4 = (float)(dVar1 * dVar3 + -dVar5);
              }
              else {
                local_4 = (float)dVar4;
              }
            }
            else {
              local_4 = (float)dVar4;
            }
          }
          else {
            dVar1 = CubicRoot(in_stack_ffffffffffffff28);
            dVar3 = dVar1 + dVar1 + -dVar5;
            if ((dVar3 < 0.0) || (1.000100016593933 < dVar3)) {
              local_4 = (float)(-dVar1 - dVar5);
            }
            else {
              local_4 = (float)dVar3;
            }
          }
        }
        else {
          sqrt(dVar3);
          dVar1 = CubicRoot(in_stack_ffffffffffffff28);
          dVar3 = CubicRoot(in_stack_ffffffffffffff28);
          local_4 = (float)((dVar1 - dVar3) - dVar5);
        }
      }
      else {
        dVar3 = dVar3 / dVar2;
        dVar4 = dVar4 / dVar2;
        if ((dVar4 != 0.0) || (NAN(dVar4))) {
          dVar1 = dVar3 * dVar3 + -(dVar4 * 4.0);
          dVar4 = sqrt(dVar1);
          dVar4 = (-dVar3 + dVar4) / 2.0;
          if ((dVar4 < 0.0) || (1.000100016593933 < dVar4)) {
            dVar1 = sqrt(dVar1);
            local_4 = (float)((-dVar3 - dVar1) / 2.0);
          }
          else {
            local_4 = (float)dVar4;
          }
        }
        else {
          local_4 = 0.0;
        }
      }
    }
    else if ((dVar3 != 0.0) || (NAN(dVar3))) {
      local_4 = (float)(-dVar4 / dVar3);
    }
    else {
      local_4 = 0.0;
    }
  }
  return local_4;
}

Assistant:

float SolveBezier(float x, float p0, float p1, float p2, float p3)
{
	// check for valid f-curve
	// we only take care of monotonic bezier curves, so there has to be exactly 1 real solution
	if(!(p0 <= x && x <= p3) || !(p0 <= p1 && p1 <= p3) || !(p0 <= p2 && p2 <= p3))
		return 0.0f;

	double a, b, c, t;
	double x3 = -p0 + 3*p1 - 3*p2 + p3;
	double x2 = 3*p0 - 6*p1 + 3*p2;
	double x1 = -3*p0 + 3*p1;
	double x0 = p0 - x;

	if(x3 == 0.0 && x2 == 0.0)
	{
		// linear
		// a*t + b = 0
		a = x1;
		b = x0;

		if(a == 0.0)
			return 0.0f;
		else
			return -b/a;
	}
	else if(x3 == 0.0)
	{
		// quadratic
		// t*t + b*t +c = 0
		b = x1/x2;
		c = x0/x2;

		if(c == 0.0)
			return 0.0f;

		double D = b*b - 4*c;

		t = (-b + sqrt(D))/2;

		if(0.0 <= t && t <= 1.0001f)
			return t;
		else
			return (-b - sqrt(D))/2;
	}
	else
	{
		// cubic
		// t*t*t + a*t*t + b*t*t + c = 0
		a = x2 / x3;
		b = x1 / x3;
		c = x0 / x3;

		// substitute t = y - a/3
		double sub = a/3.0;

		// depressed form x^3 + px + q = 0
		// cardano's method
		double p = b/3 - a*a/9;
		double q = (2*a*a*a/27 - a*b/3 + c)/2;

		double D = q*q + p*p*p;

		if(D > 0.0)
		{
			// only one 'real' solution
			double s = sqrt(D);
			return CubicRoot(s-q) - CubicRoot(s+q) - sub;
		}
		else if(D == 0.0)
		{
			// one single, one double solution or triple solution
			double s = CubicRoot(-q);
			t = 2*s - sub;

			if(0.0 <= t && t <= 1.0001f)
				return t;
			else
				return (-s - sub);

		}
		else
		{
			// Casus irreductibilis ... ,_,
			double phi = acos(-q / sqrt(-(p*p*p))) / 3;
			double s = 2*sqrt(-p);

			t = s*cos(phi) - sub;

			if(0.0 <= t && t <= 1.0001f)
				return t;

			t = -s*cos(phi+pi/3) - sub;

			if(0.0 <= t && t <= 1.0001f)
				return t;
			else
				return -s*cos(phi-pi/3) - sub;
		}
	}
}